

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QPersistentModelIndex,_QEditorInfo>::emplaceValue<QEditorInfo>
          (Node<QPersistentModelIndex,_QEditorInfo> *this,QEditorInfo *args)

{
  bool bVar1;
  Data *pDVar2;
  Data *pDVar3;
  QObject *pQVar4;
  
  pDVar3 = (args->widget).wp.d;
  pQVar4 = (args->widget).wp.value;
  (args->widget).wp.d = (Data *)0x0;
  (args->widget).wp.value = (QObject *)0x0;
  bVar1 = args->isStatic;
  pDVar2 = (this->value).widget.wp.d;
  (this->value).widget.wp.d = pDVar3;
  (this->value).widget.wp.value = pQVar4;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar2 = *(int *)pDVar2 + -1;
    UNLOCK();
    if (*(int *)pDVar2 == 0) {
      operator_delete(pDVar2);
    }
  }
  (this->value).isStatic = bVar1;
  return;
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }